

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O2

idx_t duckdb::BitStringAggOperation::GetRange<duckdb::hugeint_t>(hugeint_t min,hugeint_t max)

{
  bool bVar1;
  hugeint_t hVar2;
  hugeint_t input;
  idx_t range;
  hugeint_t result;
  hugeint_t local_28;
  hugeint_t local_18;
  
  bVar1 = TrySubtractOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                    (max,min,&result);
  if (bVar1) {
    hugeint_t::hugeint_t(&local_18,1);
    hVar2 = hugeint_t::operator+(&result,&local_18);
    input.upper = (int64_t)&range;
    input.lower = hVar2.upper;
    bVar1 = Hugeint::TryCast<unsigned_long>((Hugeint *)hVar2.lower,input,&range);
    if (bVar1) {
      local_28.lower = 0xffffffffffffffff;
      local_28.upper = 0x7fffffffffffffff;
      bVar1 = hugeint_t::operator==(&result,&local_28);
      if (!bVar1) {
        return range;
      }
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

idx_t BitStringAggOperation::GetRange(hugeint_t min, hugeint_t max) {
	hugeint_t result;
	if (!TrySubtractOperator::Operation(max, min, result)) {
		return NumericLimits<idx_t>::Maximum();
	}
	idx_t range;
	if (!Hugeint::TryCast(result + 1, range) || result == NumericLimits<hugeint_t>::Maximum()) {
		return NumericLimits<idx_t>::Maximum();
	}
	return range;
}